

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigNode.c
# Opt level: O0

void Fraig_NodeSimulate(Fraig_Node_t *pNode,int iWordStart,int iWordStop,int fUseRand)

{
  uint *puVar1;
  long lVar2;
  uint uVar3;
  uint local_70;
  uint local_6c;
  long local_68;
  int local_4c;
  int i;
  int fCompl2;
  int fCompl1;
  int fCompl;
  uint uHash;
  uint *pSims2;
  uint *pSims1;
  uint *pSims;
  int fUseRand_local;
  int iWordStop_local;
  int iWordStart_local;
  Fraig_Node_t *pNode_local;
  
  if (((ulong)pNode & 1) == 0) {
    if (fUseRand == 0) {
      puVar1 = pNode->puSimD;
      lVar2 = *(long *)(((ulong)pNode->p1 & 0xfffffffffffffffe) + 0x70);
      local_68 = *(long *)(((ulong)pNode->p2 & 0xfffffffffffffffe) + 0x70);
    }
    else {
      puVar1 = pNode->puSimR;
      lVar2 = *(long *)(((ulong)pNode->p1 & 0xfffffffffffffffe) + 0x68);
      local_68 = *(long *)(((ulong)pNode->p2 & 0xfffffffffffffffe) + 0x68);
    }
    uVar3 = *(uint *)&pNode->field_0x18 & 1;
    if (((ulong)pNode->p1 & 1) == 0) {
      local_6c = *(uint *)&pNode->p1->field_0x18 & 1;
    }
    else {
      local_6c = (uint)((*(uint *)(((ulong)pNode->p1 & 0xfffffffffffffffe) + 0x18) & 1) == 0);
    }
    if (((ulong)pNode->p2 & 1) == 0) {
      local_70 = *(uint *)&pNode->p2->field_0x18 & 1;
    }
    else {
      local_70 = (uint)((*(uint *)(((ulong)pNode->p2 & 0xfffffffffffffffe) + 0x18) & 1) == 0);
    }
    fCompl1 = 0;
    local_4c = iWordStart;
    if ((local_6c == 0) || (local_70 == 0)) {
      if ((local_6c == 0) || (local_70 != 0)) {
        if ((local_6c == 0) && (local_70 != 0)) {
          if (uVar3 == 0) {
            for (; local_4c < iWordStop; local_4c = local_4c + 1) {
              puVar1[local_4c] =
                   *(uint *)(lVar2 + (long)local_4c * 4) &
                   (*(uint *)(local_68 + (long)local_4c * 4) ^ 0xffffffff);
              fCompl1 = puVar1[local_4c] * s_FraigPrimes[local_4c] ^ fCompl1;
            }
          }
          else {
            for (; local_4c < iWordStop; local_4c = local_4c + 1) {
              puVar1[local_4c] =
                   *(uint *)(lVar2 + (long)local_4c * 4) ^ 0xffffffff |
                   *(uint *)(local_68 + (long)local_4c * 4);
              fCompl1 = puVar1[local_4c] * s_FraigPrimes[local_4c] ^ fCompl1;
            }
          }
        }
        else if (uVar3 == 0) {
          for (; local_4c < iWordStop; local_4c = local_4c + 1) {
            puVar1[local_4c] =
                 *(uint *)(lVar2 + (long)local_4c * 4) & *(uint *)(local_68 + (long)local_4c * 4);
            fCompl1 = puVar1[local_4c] * s_FraigPrimes[local_4c] ^ fCompl1;
          }
        }
        else {
          for (; local_4c < iWordStop; local_4c = local_4c + 1) {
            puVar1[local_4c] =
                 *(uint *)(lVar2 + (long)local_4c * 4) & *(uint *)(local_68 + (long)local_4c * 4) ^
                 0xffffffff;
            fCompl1 = puVar1[local_4c] * s_FraigPrimes[local_4c] ^ fCompl1;
          }
        }
      }
      else if (uVar3 == 0) {
        for (; local_4c < iWordStop; local_4c = local_4c + 1) {
          puVar1[local_4c] =
               (*(uint *)(lVar2 + (long)local_4c * 4) ^ 0xffffffff) &
               *(uint *)(local_68 + (long)local_4c * 4);
          fCompl1 = puVar1[local_4c] * s_FraigPrimes[local_4c] ^ fCompl1;
        }
      }
      else {
        for (; local_4c < iWordStop; local_4c = local_4c + 1) {
          puVar1[local_4c] =
               *(uint *)(lVar2 + (long)local_4c * 4) |
               *(uint *)(local_68 + (long)local_4c * 4) ^ 0xffffffff;
          fCompl1 = puVar1[local_4c] * s_FraigPrimes[local_4c] ^ fCompl1;
        }
      }
    }
    else if (uVar3 == 0) {
      for (; local_4c < iWordStop; local_4c = local_4c + 1) {
        puVar1[local_4c] =
             (*(uint *)(lVar2 + (long)local_4c * 4) | *(uint *)(local_68 + (long)local_4c * 4)) ^
             0xffffffff;
        fCompl1 = puVar1[local_4c] * s_FraigPrimes[local_4c] ^ fCompl1;
      }
    }
    else {
      for (; local_4c < iWordStop; local_4c = local_4c + 1) {
        puVar1[local_4c] =
             *(uint *)(lVar2 + (long)local_4c * 4) | *(uint *)(local_68 + (long)local_4c * 4);
        fCompl1 = puVar1[local_4c] * s_FraigPrimes[local_4c] ^ fCompl1;
      }
    }
    if (fUseRand == 0) {
      pNode->uHashD = fCompl1 ^ pNode->uHashD;
    }
    else {
      pNode->uHashR = fCompl1 ^ pNode->uHashR;
    }
    return;
  }
  __assert_fail("!Fraig_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fraig/fraigNode.c"
                ,0xe8,"void Fraig_NodeSimulate(Fraig_Node_t *, int, int, int)");
}

Assistant:

void Fraig_NodeSimulate( Fraig_Node_t * pNode, int iWordStart, int iWordStop, int fUseRand )
{
    unsigned * pSims, * pSims1, * pSims2;
    unsigned uHash;
    int fCompl, fCompl1, fCompl2, i;

    assert( !Fraig_IsComplement(pNode) );

    // get hold of the simulation information
    pSims  = fUseRand? pNode->puSimR                    : pNode->puSimD;
    pSims1 = fUseRand? Fraig_Regular(pNode->p1)->puSimR : Fraig_Regular(pNode->p1)->puSimD;
    pSims2 = fUseRand? Fraig_Regular(pNode->p2)->puSimR : Fraig_Regular(pNode->p2)->puSimD;

    // get complemented attributes of the children using their random info
    fCompl  = pNode->fInv;
    fCompl1 = Fraig_NodeIsSimComplement(pNode->p1);
    fCompl2 = Fraig_NodeIsSimComplement(pNode->p2);

    // simulate
    uHash = 0;
    if ( fCompl1 && fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] | pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = ~(pSims1[i] | pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }
    else if ( fCompl1 && !fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] | ~pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (~pSims1[i] & pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }
    else if ( !fCompl1 && fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (~pSims1[i] | pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] & ~pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }
    else // if ( !fCompl1 && !fCompl2 )
    {
        if ( fCompl )
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = ~(pSims1[i] & pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
        else
            for ( i = iWordStart; i < iWordStop; i++ )
            {
                pSims[i] = (pSims1[i] & pSims2[i]);
                uHash ^= pSims[i] * s_FraigPrimes[i];
            }
    }

    if ( fUseRand )
        pNode->uHashR ^= uHash;
    else
        pNode->uHashD ^= uHash;
}